

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

bool __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::Contains(S2ShapeIndexRegion<S2ShapeIndex> *this,S2Point *p)

{
  Iterator *it;
  bool bVar1;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  const_reference clipped;
  int s;
  uint n;
  bool bVar2;
  
  bVar1 = S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>(p,this->iter_);
  n = 0;
  bVar2 = false;
  if (bVar1) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              S2ShapeIndex::Iterator::cell(this->iter_);
    do {
      bVar2 = n < (*(uint *)this_00 & 0xffffff);
      if (!bVar2) {
        return bVar2;
      }
      it = this->iter_;
      clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                          (this_00,n);
      bVar1 = S2ContainsPointQuery<S2ShapeIndex>::ShapeContains(&this->contains_query_,it,clipped,p)
      ;
      n = n + 1;
    } while (!bVar1);
  }
  return bVar2;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::Contains(const S2Point& p) const {
  if (iter_.Locate(p)) {
    const S2ShapeIndexCell& cell = iter_.cell();
    for (int s = 0; s < cell.num_clipped(); ++s) {
      if (contains_query_.ShapeContains(iter_, cell.clipped(s), p)) {
        return true;
      }
    }
  }
  return false;
}